

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void icetMatrixOrtho(IceTDouble left,IceTDouble right,IceTDouble bottom,IceTDouble top,
                    IceTDouble znear,IceTDouble zfar,IceTDouble *mat_out)

{
  IceTDouble *mat_out_local;
  IceTDouble zfar_local;
  IceTDouble znear_local;
  IceTDouble top_local;
  IceTDouble bottom_local;
  IceTDouble right_local;
  IceTDouble left_local;
  
  *mat_out = (IceTDouble)(2.0 / ((double)right - (double)left));
  mat_out[1] = 0.0;
  mat_out[2] = 0.0;
  mat_out[3] = 0.0;
  mat_out[4] = 0.0;
  mat_out[5] = (IceTDouble)(2.0 / ((double)top - (double)bottom));
  mat_out[6] = 0.0;
  mat_out[7] = 0.0;
  mat_out[8] = 0.0;
  mat_out[9] = 0.0;
  mat_out[10] = (IceTDouble)(-2.0 / ((double)zfar - (double)znear));
  mat_out[0xb] = 0.0;
  mat_out[0xc] = (IceTDouble)(-((double)right + (double)left) / ((double)right - (double)left));
  mat_out[0xd] = (IceTDouble)(-((double)top + (double)bottom) / ((double)top - (double)bottom));
  mat_out[0xe] = (IceTDouble)(-((double)zfar + (double)znear) / ((double)zfar - (double)znear));
  mat_out[0xf] = 1.0;
  return;
}

Assistant:

ICET_EXPORT void icetMatrixOrtho(IceTDouble left, IceTDouble right,
                                 IceTDouble bottom, IceTDouble top,
                                 IceTDouble znear, IceTDouble zfar,
                                 IceTDouble *mat_out)
{
    mat_out[ 0] = 2.0/(right-left);
    mat_out[ 1] = 0.0;
    mat_out[ 2] = 0.0;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = 0.0;
    mat_out[ 5] = 2.0/(top-bottom);
    mat_out[ 6] = 0.0;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = 0.0;
    mat_out[ 9] = 0.0;
    mat_out[10] = -2.0/(zfar - znear);
    mat_out[11] = 0.0;

    mat_out[12] = -(right+left)/(right-left);
    mat_out[13] = -(top+bottom)/(top-bottom);
    mat_out[14] = -(zfar+znear)/(zfar-znear);
    mat_out[15] = 1.0;
}